

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

void lws_wsi_mux_dump_waiting_children(lws *wsi)

{
  lws *obj;
  lws_protocols *plVar1;
  undefined8 uVar2;
  char *pcVar3;
  lws **pplVar4;
  
  pcVar3 = lws_wsi_tag(wsi);
  _lws_log(8,"%s: %s: children waiting for POLLOUT service:\n","lws_wsi_mux_dump_waiting_children",
           pcVar3);
  pplVar4 = &(wsi->mux).child_list;
  while (obj = *pplVar4, obj != (lws *)0x0) {
    uVar2 = 0x2a;
    if ((obj->mux).requested_POLLOUT == '\0') {
      uVar2 = 0x20;
    }
    plVar1 = (obj->a).protocol;
    pcVar3 = "noprotocol";
    if (plVar1 != (lws_protocols *)0x0) {
      pcVar3 = plVar1->name;
    }
    _lws_log_cx((obj->lc).log_cx,lws_log_prepend_wsi,obj,8,"lws_wsi_mux_dump_waiting_children",
                "  %c sid %u: 0x%x %s %s",uVar2,(ulong)(obj->mux).my_sid,
                (ulong)(ushort)obj->wsistate,obj->role_ops->name,pcVar3);
    pplVar4 = &(obj->mux).sibling_list;
  }
  return;
}

Assistant:

void
lws_wsi_mux_dump_waiting_children(struct lws *wsi)
{
#if defined(_DEBUG)
	lwsl_info("%s: %s: children waiting for POLLOUT service:\n",
		  __func__, lws_wsi_tag(wsi));

	wsi = wsi->mux.child_list;
	while (wsi) {
		lwsl_wsi_info(wsi, "  %c sid %u: 0x%x %s %s",
			  wsi->mux.requested_POLLOUT ? '*' : ' ',
			  wsi->mux.my_sid, lwsi_state(wsi),
			  wsi->role_ops->name,
			  wsi->a.protocol ? wsi->a.protocol->name : "noprotocol");

		wsi = wsi->mux.sibling_list;
	}
#endif
}